

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaPrs.h
# Opt level: O0

char * Prs_ManLoadFile(char *pFileName,char **ppLimit)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  FILE *pFile;
  int RetValue;
  int nFileSize;
  char *pBuffer;
  char **ppLimit_local;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open input file.\n");
    pFileName_local = (char *)0x0;
  }
  else {
    fseek(__stream,0,2);
    lVar2 = ftell(__stream);
    iVar1 = (int)lVar2;
    rewind(__stream);
    pFileName_local = (char *)malloc((long)(iVar1 + 0x10));
    *pFileName_local = '\n';
    fread(pFileName_local + 1,(long)iVar1,1,__stream);
    fclose(__stream);
    pFileName_local[iVar1 + 1] = '\n';
    pFileName_local[iVar1 + 2] = '\0';
    *ppLimit = pFileName_local + (long)iVar1 + 3;
  }
  return pFileName_local;
}

Assistant:

static inline char * Prs_ManLoadFile( char * pFileName, char ** ppLimit )
{
    char * pBuffer;
    int nFileSize, RetValue;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file.\n" );
        return NULL;
    }
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );  
    nFileSize = ftell( pFile );  
    // move the file current reading position to the beginning
    rewind( pFile ); 
    // load the contents of the file into memory
    pBuffer = ABC_ALLOC( char, nFileSize + 16 );
    pBuffer[0] = '\n';
    RetValue = fread( pBuffer+1, nFileSize, 1, pFile );
    fclose( pFile );
    // terminate the string with '\0'
    pBuffer[nFileSize + 1] = '\n';
    pBuffer[nFileSize + 2] = '\0';
    *ppLimit = pBuffer + nFileSize + 3;
    return pBuffer;
}